

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool __thiscall ExpressionContext::IsIntegerType(ExpressionContext *this,TypeBase *type)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((this->typeBool != type) && (this->typeChar != type)) && (this->typeShort != type)) &&
     (this->typeInt != type)) {
    bVar1 = this->typeLong == type;
  }
  return bVar1;
}

Assistant:

bool ExpressionContext::IsIntegerType(TypeBase* type)
{
	if(type == typeBool)
		return true;

	if(type == typeChar)
		return true;

	if(type == typeShort)
		return true;

	if(type == typeInt)
		return true;

	if(type == typeLong)
		return true;

	return false;
}